

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O1

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenerateViolationsReport
          (SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SolCheck *chk,bool param_2)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  MemoryWriter wrt;
  string local_298;
  long *local_278 [2];
  long local_268 [2];
  MemoryWriter local_258;
  
  local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00447498;
  pcVar1 = local_258.buffer_.data_;
  local_258.buffer_.super_Buffer<char>.size_ = 0;
  local_258.buffer_.super_Buffer<char>.capacity_ = 500;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
  local_258.buffer_.super_Buffer<char>.ptr_ = pcVar1;
  bVar3 = SolCheck::HasAnyConViols(chk);
  paVar2 = &local_298.field_2;
  if (bVar3) {
    local_298._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"variable bounds","");
    Gen1Viol(this,(chk->viol_var_bnds_)._M_elems,&local_258,true,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"aux var bounds","");
    Gen1Viol(this,(chk->viol_var_bnds_)._M_elems + 1,&local_258,true,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"variable integrality","");
    Gen1Viol(this,(chk->viol_var_int_)._M_elems,&local_258,true,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    local_298._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"aux var integrality","");
    Gen1Viol(this,(chk->viol_var_int_)._M_elems + 1,&local_258,true,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  GenConViol(this,&chk->viol_cons_alg_,&local_258,0);
  GenConViol(this,&chk->viol_cons_log_,&local_258,1);
  if ((chk->viol_obj_).N_ != 0) {
    local_298._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"objective(s)","");
    Gen1Viol(this,&chk->viol_obj_,&local_258,true,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,(local_258.super_BasicWriter<char>.buffer_)->ptr_,
             (local_258.super_BasicWriter<char>.buffer_)->ptr_ +
             (local_258.super_BasicWriter<char>.buffer_)->size_);
  std::__cxx11::string::operator=((string *)&chk->report_,(string *)local_278);
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  local_258.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00447498;
  local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
  if (local_258.buffer_.super_Buffer<char>.ptr_ != pcVar1) {
    operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                    local_258.buffer_.super_Buffer<char>.capacity_);
  }
  return;
}

Assistant:

void GenerateViolationsReport(
      SolCheck& chk, bool ) {
    fmt::MemoryWriter wrt;
    if (chk.HasAnyConViols()) {
      Gen1Viol(chk.VarViolBnds().at(0), wrt, true,
               "variable bounds");
      Gen1Viol(chk.VarViolBnds().at(1), wrt, true,
               "aux var bounds");
      Gen1Viol(chk.VarViolIntty().at(0), wrt, true,
               "variable integrality");
      Gen1Viol(chk.VarViolIntty().at(1), wrt, true,
               "aux var integrality");
    }
    GenConViol(chk.ConViolAlg(), wrt, 0);
    GenConViol(chk.ConViolLog(), wrt, 1);
    if (chk.HasAnyObjViols()) {
      Gen1Viol(chk.ObjViols(), wrt, true,
               "objective(s)");
    }
    chk.SetReport( wrt.str() );
  }